

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void f_luaopen(lua_State *L,void *ud)

{
  StkId pTVar1;
  byte *pbVar2;
  global_State *pgVar3;
  global_State *pgVar4;
  char *pcVar5;
  CallInfo *pCVar6;
  StkId pTVar7;
  GCObject *pGVar8;
  size_t sVar9;
  TString *pTVar10;
  lu_byte lVar11;
  long lVar12;
  
  pgVar3 = L->l_G;
  lVar12 = 0;
  pCVar6 = (CallInfo *)luaM_realloc_(L,(void *)0x0,0,0x140);
  L->base_ci = pCVar6;
  L->ci = pCVar6;
  L->size_ci = 8;
  L->end_ci = pCVar6 + 7;
  pTVar7 = (StkId)luaM_realloc_(L,(void *)0x0,0,0x2d0);
  L->stack = pTVar7;
  L->stacksize = 0x2d;
  L->top = pTVar7;
  L->stack_last = pTVar7 + 0x27;
  pCVar6 = L->ci;
  pCVar6->func = pTVar7;
  pTVar1 = pTVar7 + 1;
  L->top = pTVar1;
  pTVar7->tt = 0;
  pCVar6->base = pTVar1;
  L->base = pTVar1;
  pCVar6->top = pTVar7 + 0x15;
  pGVar8 = (GCObject *)luaH_new(L,0,2);
  (L->l_gt).value.gc = pGVar8;
  (L->l_gt).tt = 5;
  pgVar4 = L->l_G;
  pGVar8 = (GCObject *)luaH_new(L,0,2);
  (pgVar4->l_registry).value.gc = pGVar8;
  (pgVar4->l_registry).tt = 5;
  luaS_resize(L,0x20);
  do {
    pcVar5 = *(char **)((long)&luaT_init_luaT_eventname + lVar12);
    sVar9 = strlen(pcVar5);
    pTVar10 = luaS_newlstr(L,pcVar5,sVar9);
    *(TString **)((long)L->l_G->tmname + lVar12) = pTVar10;
    pbVar2 = (byte *)(*(long *)((long)L->l_G->tmname + lVar12) + 9);
    *pbVar2 = *pbVar2 | 0x20;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x88);
  lVar11 = '\x01';
  lVar12 = 0;
  do {
    pcVar5 = *(char **)((long)luaX_tokens + lVar12);
    sVar9 = strlen(pcVar5);
    pTVar10 = luaS_newlstr(L,pcVar5,sVar9);
    (pTVar10->tsv).marked = (pTVar10->tsv).marked | 0x20;
    (pTVar10->tsv).reserved = lVar11;
    lVar12 = lVar12 + 8;
    lVar11 = lVar11 + '\x01';
  } while (lVar12 != 0xa8);
  pTVar10 = luaS_newlstr(L,"not enough memory",0x11);
  (pTVar10->tsv).marked = (pTVar10->tsv).marked | 0x20;
  pgVar3->GCthreshold = pgVar3->totalbytes << 2;
  return;
}

Assistant:

static void f_luaopen(lua_State*L,void*ud){
global_State*g=G(L);
UNUSED(ud);
stack_init(L,L);
sethvalue(L,gt(L),luaH_new(L,0,2));
sethvalue(L,registry(L),luaH_new(L,0,2));
luaS_resize(L,32);
luaT_init(L);
luaX_init(L);
luaS_fix(luaS_newliteral(L,"not enough memory"));
g->GCthreshold=4*g->totalbytes;
}